

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void * hash_table_delete_item(hash_table_t *table,void *key)

{
  size_t sVar1;
  hash_table_bucket_t *phVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  hash_table_bucket_t *phVar6;
  hash_table_bucket_t *c;
  hash_table_bucket_t **pphVar7;
  
  sVar1 = (table->ghash).mult;
  sVar4 = (*table->hash)(key);
  uVar5 = sVar4 * sVar1 + (table->ghash).add >> (-(char)(table->ghash).log2_buckets & 0x3fU) &
          0xffffffff;
  phVar6 = table->buckets[uVar5].next;
  if (phVar6 != (hash_table_bucket_t *)0x0) {
    phVar2 = table->buckets + uVar5;
    do {
      pphVar7 = &phVar2->next;
      iVar3 = (*table->is_equal)(key,phVar6->data);
      phVar2 = *pphVar7;
      phVar6 = phVar2->next;
      if (iVar3 != 0) {
        *pphVar7 = phVar6;
        table->n_items = table->n_items - 1;
        phVar2->next = table->free_buckets;
        table->free_buckets = phVar2;
        return phVar2->data;
      }
    } while (phVar6 != (hash_table_bucket_t *)0x0);
  }
  return (void *)0x0;
}

Assistant:

void * hash_table_delete_item( hash_table_t * table, void * key )
{
    unsigned i = (unsigned) hash( table->ghash, (* table->hash )( key ) );
    hash_table_bucket_t **b = & table->buckets[i].next;
   
    while (*b) {
        if ( (*table->is_equal)(key, (*b)->data) )
        {
            hash_table_bucket_t * c = *b;
            *b = (*b)->next;
            table->n_items -= 1;
            c->next = table->free_buckets;
            table->free_buckets = c;
            return c->data;
        }
        b = &(*b)->next;
    }
    return NULL;
}